

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cc
# Opt level: O2

void list_push_back(list *list,list_elem *e)

{
  list_elem *plVar1;
  list *plVar2;
  
  plVar1 = list->tail;
  plVar2 = (list *)&plVar1->next;
  if (plVar1 == (list_elem *)0x0) {
    plVar2 = list;
  }
  plVar2->head = e;
  list->tail = e;
  e->prev = plVar1;
  e->next = (list_elem *)0x0;
  return;
}

Assistant:

void list_push_back(struct list *list, struct list_elem *e)
{
    IFDEF_LOCK( spin_lock(&list->lock); );
    if (list->tail == NULL) {
        list->head = e;
        list->tail = e;
        e->next = e->prev = NULL;
    }else{
        list->tail->next = e;
        e->prev = list->tail;
        e->next = NULL;
        list->tail = e;
    }
    IFDEF_LOCK( spin_unlock(&list->lock); );
}